

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockFormerVisitor.cpp
# Opt level: O2

void __thiscall
IRT::BlockFormerVisitor::Visit(BlockFormerVisitor *this,TempExpression *temp_expression)

{
  TempExpression *this_00;
  Temporary TStack_38;
  
  this_00 = (TempExpression *)operator_new(0x28);
  std::__cxx11::string::string((string *)&TStack_38,(string *)&temp_expression->temporary_);
  TempExpression::TempExpression(this_00,&TStack_38);
  (this->super_TemplateVisitor<IRT::IRTStorage>).tos_value_.expression_ = (Expression *)this_00;
  std::__cxx11::string::~string((string *)&TStack_38);
  return;
}

Assistant:

void BlockFormerVisitor::Visit(TempExpression* temp_expression) {
  tos_value_.expression_ = new TempExpression(temp_expression->temporary_);
}